

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O0

void * FilterRender::doAuto(void *data,uint width,uint height)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  uint local_bc;
  uint local_b8;
  int j_9;
  int i_10;
  int k_5;
  int j_8;
  int i_9;
  int k_4;
  int j_7;
  int k_3;
  int j_6;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int k_2;
  int common_1;
  int k_1;
  int common;
  int j;
  int i;
  int i_4;
  int j_5;
  int j_4;
  int j_3;
  bool flag;
  int i_3;
  int margin;
  int k;
  int j_2;
  int i_2;
  uchar *p;
  int j_1;
  int i_1;
  bool *all;
  int *ri;
  int *le;
  uchar ***map;
  uint height_local;
  uint width_local;
  void *data_local;
  
  uVar4 = SUB168(ZEXT416(height) * ZEXT816(8),0);
  if (SUB168(ZEXT416(height) * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  uVar4 = SUB168(ZEXT416(height) * ZEXT816(4),0);
  if (SUB168(ZEXT416(height) * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  uVar4 = SUB168(ZEXT416(height) * ZEXT816(4),0);
  if (SUB168(ZEXT416(height) * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar4);
  pvVar8 = operator_new__((ulong)height);
  for (p._4_4_ = 0; p._4_4_ < height; p._4_4_ = p._4_4_ + 1) {
    uVar4 = SUB168(ZEXT416(width) * ZEXT816(8),0);
    if (SUB168(ZEXT416(width) * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar4);
    *(void **)((long)pvVar5 + (long)(int)p._4_4_ * 8) = pvVar9;
    for (p._0_4_ = 0; (uint)p < width; p._0_4_ = (uint)p + 1) {
      pvVar9 = operator_new__(4);
      *(void **)(*(long *)((long)pvVar5 + (long)(int)p._4_4_ * 8) + (long)(int)(uint)p * 8) = pvVar9
      ;
    }
  }
  _j_2 = data;
  for (k = 0; (uint)k < height; k = k + 1) {
    for (margin = 0; (uint)margin < width; margin = margin + 1) {
      for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
        *(undefined1 *)
         (*(long *)(*(long *)((long)pvVar5 + (long)k * 8) + (long)margin * 8) + (long)i_3) =
             *(undefined1 *)((long)_j_2 + (long)i_3);
      }
      _j_2 = (void *)((long)_j_2 + 4);
    }
  }
  j_3 = 0;
  do {
    if (height <= (uint)j_3) {
      for (j = 0; (uint)j < height; j = j + 1) {
        if (*(int *)((long)pvVar6 + (long)j * 4) < *(int *)((long)pvVar7 + (long)j * 4)) {
          *(undefined1 *)((long)pvVar8 + (long)j) = 0;
        }
        else {
          *(undefined1 *)((long)pvVar8 + (long)j) = 1;
        }
      }
      common = 0;
      while ((uint)common < height) {
        k_1 = common;
        common_1 = *(int *)((long)pvVar6 + (long)common * 4);
        while (((uint)k_1 < height && ((*(byte *)((long)pvVar8 + (long)k_1) & 1) == 0))) {
          if (*(int *)((long)pvVar6 + (long)k_1 * 4) < common_1) {
            common_1 = *(int *)((long)pvVar6 + (long)k_1 * 4);
          }
          k_1 = k_1 + 1;
        }
        for (k_2 = common; k_2 < k_1; k_2 = k_2 + 1) {
          if ((*(byte *)((long)pvVar8 + (long)k_2) & 1) == 0) {
            *(int *)((long)pvVar6 + (long)k_2 * 4) = common_1;
          }
        }
        common = k_1 + 1;
      }
      common = 0;
      while ((uint)common < height) {
        k_1 = common;
        i_5 = *(int *)((long)pvVar7 + (long)common * 4);
        while (((uint)k_1 < height && ((*(byte *)((long)pvVar8 + (long)k_1) & 1) == 0))) {
          if (i_5 < *(int *)((long)pvVar7 + (long)k_1 * 4)) {
            i_5 = *(int *)((long)pvVar7 + (long)k_1 * 4);
          }
          k_1 = k_1 + 1;
        }
        for (i_6 = common; i_6 < k_1; i_6 = i_6 + 1) {
          if ((*(byte *)((long)pvVar8 + (long)i_6) & 1) == 0) {
            *(int *)((long)pvVar7 + (long)i_6 * 4) = i_5;
          }
        }
        common = k_1 + 1;
      }
      i_7 = 0;
      while (((uint)i_7 < height && ((*(byte *)((long)pvVar8 + (long)i_7) & 1) != 0))) {
        *(uint *)((long)pvVar6 + (long)i_7 * 4) = width;
        *(undefined4 *)((long)pvVar7 + (long)i_7 * 4) = 0;
        *(undefined1 *)((long)pvVar8 + (long)i_7) = 0;
        i_7 = i_7 + 1;
      }
      i_8 = height - 1;
      while ((-1 < i_8 && ((*(byte *)((long)pvVar8 + (long)i_8) & 1) != 0))) {
        *(uint *)((long)pvVar6 + (long)i_8 * 4) = width;
        *(undefined4 *)((long)pvVar7 + (long)i_8 * 4) = 0;
        *(undefined1 *)((long)pvVar8 + (long)i_8) = 0;
        i_8 = i_8 + -1;
      }
      for (j_6 = 1; (uint)j_6 < height; j_6 = j_6 + 1) {
        if ((*(byte *)((long)pvVar8 + (long)j_6) & 1) != 0) {
          *(undefined4 *)((long)pvVar6 + (long)j_6 * 4) =
               *(undefined4 *)((long)pvVar6 + (long)(j_6 + -1) * 4);
          *(undefined4 *)((long)pvVar7 + (long)j_6 * 4) =
               *(undefined4 *)((long)pvVar7 + (long)(j_6 + -1) * 4);
        }
      }
      for (k_3 = 0; (uint)k_3 < height; k_3 = k_3 + 1) {
        for (j_7 = 0; j_7 < *(int *)((long)pvVar6 + (long)k_3 * 4); j_7 = j_7 + 1) {
          for (k_4 = 0; k_4 < 4; k_4 = k_4 + 1) {
            *(undefined1 *)
             (*(long *)(*(long *)((long)pvVar5 + (long)k_3 * 8) + (long)j_7 * 8) + (long)k_4) = 0xff
            ;
          }
        }
        for (i_9 = width - 1; *(int *)((long)pvVar7 + (long)k_3 * 4) <= i_9; i_9 = i_9 + -1) {
          for (j_8 = 0; j_8 < 4; j_8 = j_8 + 1) {
            *(undefined1 *)
             (*(long *)(*(long *)((long)pvVar5 + (long)k_3 * 8) + (long)i_9 * 8) + (long)j_8) = 0;
          }
        }
      }
      _j_2 = data;
      for (k_5 = 0; (uint)k_5 < height; k_5 = k_5 + 1) {
        for (i_10 = 0; (uint)i_10 < width; i_10 = i_10 + 1) {
          for (j_9 = 0; j_9 < 4; j_9 = j_9 + 1) {
            *(undefined1 *)((long)_j_2 + (long)j_9) =
                 *(undefined1 *)
                  (*(long *)(*(long *)((long)pvVar5 + (long)k_5 * 8) + (long)i_10 * 8) + (long)j_9);
          }
          _j_2 = (void *)((long)_j_2 + 4);
        }
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete__(pvVar6);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      for (local_b8 = 0; local_b8 < height; local_b8 = local_b8 + 1) {
        for (local_bc = 0; local_bc < width; local_bc = local_bc + 1) {
          pvVar6 = *(void **)(*(long *)((long)pvVar5 + (long)(int)local_b8 * 8) +
                             (long)(int)local_bc * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
          }
        }
        pvVar6 = *(void **)((long)pvVar5 + (long)(int)local_b8 * 8);
        if (pvVar6 != (void *)0x0) {
          operator_delete__(pvVar6);
        }
      }
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar3 = true;
    *(undefined4 *)((long)pvVar6 + (long)j_3 * 4) = 0;
    *(uint *)((long)pvVar7 + (long)j_3 * 4) = width;
    for (j_5 = 0; j_5 < 5; j_5 = j_5 + 1) {
      bVar2 = equal((uchar *)**(undefined8 **)((long)pvVar5 + (long)j_3 * 8),
                    *(uchar **)(*(long *)((long)pvVar5 + (long)j_3 * 8) + (long)j_5 * 8));
      if (!bVar2) {
        bVar3 = false;
        break;
      }
      *(int *)((long)pvVar6 + (long)j_3 * 4) = j_5;
    }
    if (bVar3) {
      i_4 = 0;
      while (((uint)i_4 < width - 5 &&
             (bVar3 = equal(*(uchar **)(*(long *)((long)pvVar5 + (long)j_3 * 8) + (long)i_4 * 8),
                            *(uchar **)
                             (*(long *)((long)pvVar5 + (long)j_3 * 8) + (long)(i_4 + 5) * 8)), bVar3
             ))) {
        *(int *)((long)pvVar6 + (long)j_3 * 4) = i_4;
        i_4 = i_4 + 1;
      }
      i = width - 1;
      while ((*(int *)((long)pvVar6 + (long)j_3 * 4) <= i &&
             (bVar3 = equal(*(uchar **)(*(long *)((long)pvVar5 + (long)j_3 * 8) + (long)i * 8),
                            *(uchar **)
                             (*(long *)((long)pvVar5 + (long)j_3 * 8) + (long)(i + -5) * 8)), bVar3)
             )) {
        *(int *)((long)pvVar7 + (long)j_3 * 4) = i;
        i = i + -1;
      }
    }
    j_3 = j_3 + 1;
  } while( true );
}

Assistant:

void* FilterRender::doAuto(void *data, uint width, uint height) {
	unsigned char ***map;
	int *le;
	int *ri;
	bool *all;

	map = new unsigned char**[height];
	le = new int[height];
	ri = new int[height];
	all = new bool[height];

	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	const int margin = 5;

	for (int i = 0; i < height; i++) {
		bool flag = true;
		le[i] = 0;
		ri[i] = width;
		for (int j = 0; j < margin; j++) {
			if (equal(map[i][0], map[i][j])) {
				le[i] = j;
			} else {
				flag = false;
				break;
			}
		}
		if (!flag) continue;
		for (int j = 0; j < width - margin; j++) {
			if (equal(map[i][j], map[i][j + margin])) {
				le[i] = j;
			} else {
				break;
			}
		}
		for (int j = width - 1; j >= le[i]; j--) {
			if (equal(map[i][j], map[i][j - margin])) {
				ri[i] = j;
			} else {
				break;
			}
		}
	}

	for (int i = 0; i < height; i++) {
		if (le[i] >= ri[i]) {
			all[i] = true;
		} else {
			all[i] = false;
		}
	}

	int i, j;
	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = le[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (le[j] < common) {
				common = le[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			le[k] = common;
		}
	}

	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = ri[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (ri[j] > common) {
				common = ri[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			ri[k] = common;
		}
	}

	for (int i = 0; i < height; i++) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;

	}

	for (int i = height - 1; i >= 0; i--) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;
	}

	for (int i = 1; i < height; i++) {
		if (all[i]) {
			le[i] = le[i - 1];
			ri[i] = ri[i - 1];
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < le[i]; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 255;
			}
		}
		for (int j = width - 1; j >= ri[i]; j--) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 0;
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	delete [] le;
	delete [] ri;
	delete [] all;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}